

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O0

void xm_envelope_calculate_value(IT_ENVELOPE *envelope,IT_PLAYING_ENVELOPE *pe)

{
  int iVar1;
  uint uVar2;
  int t;
  int ye;
  int te;
  int ts;
  int ys;
  IT_PLAYING_ENVELOPE *pe_local;
  IT_ENVELOPE *envelope_local;
  
  if (pe->next_node < 1) {
    pe->value = (int)envelope->node_y[0] << 8;
  }
  else if (pe->next_node < (int)(uint)envelope->n_nodes) {
    iVar1 = envelope->node_y[pe->next_node + -1] * 0x100;
    uVar2 = (uint)envelope->node_t[pe->next_node + -1];
    if (uVar2 == envelope->node_t[pe->next_node]) {
      pe->value = iVar1;
    }
    else {
      pe->value = iVar1 + (int)((envelope->node_y[pe->next_node] * 0x100 +
                                envelope->node_y[pe->next_node + -1] * -0x100) * (pe->tick - uVar2))
                          / (int)(envelope->node_t[pe->next_node] - uVar2);
    }
  }
  else {
    pe->value = (int)envelope->node_y[(int)(envelope->n_nodes - 1)] << 8;
  }
  return;
}

Assistant:

static void xm_envelope_calculate_value(IT_ENVELOPE *envelope, IT_PLAYING_ENVELOPE *pe)
{
	if (pe->next_node <= 0)
		pe->value = envelope->node_y[0] << IT_ENVELOPE_SHIFT;
	else if (pe->next_node >= envelope->n_nodes)
		pe->value = envelope->node_y[envelope->n_nodes-1] << IT_ENVELOPE_SHIFT;
	else {
		int ys = envelope->node_y[pe->next_node-1] << IT_ENVELOPE_SHIFT;
		int ts = envelope->node_t[pe->next_node-1];
		int te = envelope->node_t[pe->next_node];

		if (ts == te)
			pe->value = ys;
		else {
			int ye = envelope->node_y[pe->next_node] << IT_ENVELOPE_SHIFT;
			int t = pe->tick;

			pe->value = ys + (ye - ys) * (t - ts) / (te - ts);
		}
	}
}